

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_sha512.cpp
# Opt level: O0

void __thiscall CHMAC_SHA512::CHMAC_SHA512(CHMAC_SHA512 *this,uchar *key,size_t keylen)

{
  CSHA512 *in_RDX;
  uchar *in_RSI;
  CSHA512 *in_RDI;
  long in_FS_OFFSET;
  int n_1;
  int n;
  uchar rkey [128];
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  int iVar1;
  CSHA512 *this_00;
  byte local_88 [128];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  CSHA512::CSHA512(in_RDI);
  CSHA512::CSHA512(in_RDI);
  if (in_RDX < (CSHA512 *)0x81) {
    memcpy(local_88,in_RSI,(size_t)in_RDX);
    memset(local_88 + (long)in_RDX,0,0x80 - (long)in_RDX);
  }
  else {
    CSHA512::CSHA512(in_RDI);
    CSHA512::Write(this_00,in_RSI,(size_t)in_RDX);
    CSHA512::Finalize(in_RDX,(uchar *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90))
    ;
    memset(local_88 + 0x40,0,0x40);
  }
  for (iVar1 = 0; iVar1 < 0x80; iVar1 = iVar1 + 1) {
    local_88[iVar1] = local_88[iVar1] ^ 0x5c;
  }
  CSHA512::Write(this_00,in_RSI,(size_t)in_RDX);
  for (iVar1 = 0; iVar1 < 0x80; iVar1 = iVar1 + 1) {
    local_88[iVar1] = local_88[iVar1] ^ 0x6a;
  }
  CSHA512::Write(this_00,in_RSI,(size_t)in_RDX);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CHMAC_SHA512::CHMAC_SHA512(const unsigned char* key, size_t keylen)
{
    unsigned char rkey[128];
    if (keylen <= 128) {
        memcpy(rkey, key, keylen);
        memset(rkey + keylen, 0, 128 - keylen);
    } else {
        CSHA512().Write(key, keylen).Finalize(rkey);
        memset(rkey + 64, 0, 64);
    }

    for (int n = 0; n < 128; n++)
        rkey[n] ^= 0x5c;
    outer.Write(rkey, 128);

    for (int n = 0; n < 128; n++)
        rkey[n] ^= 0x5c ^ 0x36;
    inner.Write(rkey, 128);
}